

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O2

void __thiscall
ImageProvider::provideStreamData(ImageProvider *this,QPDFObjGen *param_1,Pipeline *pipeline)

{
  bool bVar1;
  size_t j;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  shared_ptr<Pipeline> p_new;
  vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> to_delete;
  uint local_90;
  uint local_8c;
  string *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_80 [2];
  __shared_ptr<Pl_DCT,_(__gnu_cxx::_Lock_policy)2> local_70;
  Pipeline *local_60;
  vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> local_58;
  ulong local_40;
  J_COLOR_SPACE local_34;
  size_type local_30;
  
  local_58.
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88 = (string *)0x0;
  a_Stack_80[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60 = pipeline;
  bVar1 = std::operator==(&this->filter,"/DCTDecode");
  if (bVar1) {
    local_8c = QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::convert(&this->width)
    ;
    local_40 = this->n_stripes * this->stripe_height;
    local_90 = QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::convert(&local_40);
    local_30 = ((this->stripes).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_34 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert(&local_30);
    std::
    make_shared<Pl_DCT,char_const(&)[14],Pipeline*&,unsigned_int,unsigned_int,int,J_COLOR_SPACE&>
              ((char (*) [14])&local_70,(Pipeline **)"image encoder",(uint *)&local_60,&local_8c,
               (int *)&local_90,&local_34);
    std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&local_88,&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
              (&local_58,(value_type *)&local_88);
    pipeline = (Pipeline *)local_88;
  }
  else {
    bVar1 = std::operator==(&this->filter,"/RunLengthDecode");
    if (bVar1) {
      local_40 = local_40 & 0xffffffff00000000;
      std::make_shared<Pl_RunLength,char_const(&)[14],Pipeline*&,Pl_RunLength::action_e>
                ((char (*) [14])&local_70,(Pipeline **)"image encoder",(action_e *)&local_60);
      std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&local_88,
                 (__shared_ptr<Pl_RunLength,_(__gnu_cxx::_Lock_policy)2> *)&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
                (&local_58,(value_type *)&local_88);
      pipeline = (Pipeline *)local_88;
    }
  }
  for (uVar3 = 0; uVar3 < this->n_stripes; uVar3 = uVar3 + 1) {
    for (uVar2 = 0; uVar2 < this->stripe_height * this->width; uVar2 = uVar2 + 1) {
      Pipeline::writeString((string *)pipeline);
    }
  }
  (**(code **)(*(long *)pipeline + 0x18))(pipeline);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_80);
  std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::~vector
            (&local_58);
  return;
}

Assistant:

void
ImageProvider::provideStreamData(QPDFObjGen const&, Pipeline* pipeline)
{
    std::vector<std::shared_ptr<Pipeline>> to_delete;
    Pipeline* p = pipeline;
    std::shared_ptr<Pipeline> p_new;

    if (filter == "/DCTDecode") {
        p_new = std::make_shared<Pl_DCT>(
            "image encoder",
            pipeline,
            QIntC::to_uint(width),
            QIntC::to_uint(getHeight()),
            QIntC::to_int(stripes[0].length()),
            j_color_space);
        to_delete.push_back(p_new);
        p = p_new.get();
    } else if (filter == "/RunLengthDecode") {
        p_new = std::make_shared<Pl_RunLength>("image encoder", pipeline, Pl_RunLength::a_encode);
        to_delete.push_back(p_new);
        p = p_new.get();
    }

    for (size_t i = 0; i < n_stripes; ++i) {
        for (size_t j = 0; j < width * stripe_height; ++j) {
            p->writeString(stripes[i]);
        }
    }
    p->finish();
}